

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::copy(Fl_Input_ *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  EVP_PKEY_CTX *dst_00;
  
  iVar1 = this->position_;
  iVar2 = this->mark_;
  iVar3 = 0;
  if (iVar1 != iVar2) {
    iVar3 = iVar2;
    if (iVar1 < iVar2) {
      iVar3 = iVar1;
    }
    uVar4 = (long)iVar1 - (long)iVar2;
    uVar5 = -uVar4;
    if (0 < (long)uVar4) {
      uVar5 = uVar4;
    }
    dst_00 = (EVP_PKEY_CTX *)(uVar5 & 0xffffffff);
    if (((this->super_Fl_Widget).type_ & 7) == 5) {
      dst_00 = (EVP_PKEY_CTX *)0x0;
    }
    Fl::copy((Fl *)(this->value_ + iVar3),dst_00,(EVP_PKEY_CTX *)((ulong)dst & 0xffffffff));
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Fl_Input_::copy(int clipboard) {
  int b = position();
  int e = mark();
  if (b != e) {
    if (b > e) {b = mark(); e = position();}
    if (input_type() == FL_SECRET_INPUT) e = b;
    Fl::copy(value()+b, e-b, clipboard);
    return 1;
  }
  return 0;
}